

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseIdentifierOrFunctionInvocationExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  element_type *peVar2;
  element_type *peVar3;
  optional<std::shared_ptr<IdentifierExpressionAstNode>_> local_b8;
  optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  size_t lookAhead;
  string local_58;
  undefined1 local_38 [16];
  shared_ptr<Token> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  Parser *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)&local_28);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_28);
  TVar1 = peVar2->tokenType;
  std::shared_ptr<Token>::~shared_ptr(&local_28);
  if (TVar1 == Identifier) {
    local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    while( true ) {
      peVar3 = std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      TokenBuffer::tokenAt((TokenBuffer *)local_78,(size_t)peVar3);
      peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_78);
      TVar1 = peVar2->tokenType;
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_78);
      if (TVar1 != WhiteSpace) break;
      local_78._16_8_ = (long)(_func_int ***)local_78._16_8_ + 1;
    }
    peVar3 = std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    TokenBuffer::tokenAt((TokenBuffer *)local_88,(size_t)peVar3);
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_88);
    TVar1 = peVar2->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_88);
    if (TVar1 == LeftParen) {
      parseFunctionInvocationExpression(&local_a0,this);
      std::optional<std::shared_ptr<ExpressionAstNode>_>::
      optional<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true>
                (__return_storage_ptr__,&local_a0);
      std::optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_>::~optional(&local_a0);
    }
    else {
      parseIdentiferExpression(&local_b8,this);
      std::optional<std::shared_ptr<ExpressionAstNode>_>::
      optional<std::shared_ptr<IdentifierExpressionAstNode>,_true>(__return_storage_ptr__,&local_b8)
      ;
      std::optional<std::shared_ptr<IdentifierExpressionAstNode>_>::~optional(&local_b8);
    }
  }
  else {
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Expected an identifier.",
               (allocator<char> *)((long)&lookAhead + 7));
    reportError(this,(shared_ptr<Token> *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lookAhead + 7));
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_38);
    std::optional<std::shared_ptr<ExpressionAstNode>_>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseIdentifierOrFunctionInvocationExpression() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    this->reportError(this->tokenBuffer->currentToken(), "Expected an identifier.");
    return std::nullopt;
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::LeftParen) {
    return this->parseFunctionInvocationExpression();
  }

  return this->parseIdentiferExpression();
}